

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

uint64_t SSL_get_read_sequence(SSL *ssl)

{
  DTLSRecordNumber local_10;
  
  if (ssl->method->is_dtls != false) {
    bssl::DTLSRecordNumber::DTLSRecordNumber
              (&local_10,(ssl->d1->read_epoch).epoch,(ssl->d1->read_epoch).bitmap.max_seq_num_);
    return local_10.combined_;
  }
  return ssl->s3->read_sequence;
}

Assistant:

uint64_t SSL_get_read_sequence(const SSL *ssl) {
  if (SSL_is_dtls(ssl)) {
    // TODO(crbug.com/42290608): This API should not be implemented for DTLS or
    // QUIC. In QUIC we do not maintain a sequence number.
    const DTLSReadEpoch *read_epoch = &ssl->d1->read_epoch;
    return DTLSRecordNumber(read_epoch->epoch, read_epoch->bitmap.max_seq_num())
        .combined();
  }
  return ssl->s3->read_sequence;
}